

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O1

void __thiscall zmq::stream_engine_base_t::zap_msg_available(stream_engine_base_t *this)

{
  bool bVar1;
  int iVar2;
  
  if (this->_mechanism == (mechanism_t *)0x0) {
    zap_msg_available();
  }
  iVar2 = (*this->_mechanism->_vptr_mechanism_t[6])();
  if (iVar2 != -1) {
    if ((this->_input_stopped == true) && (bVar1 = restart_input(this), !bVar1)) {
      return;
    }
    if (this->_output_stopped != true) {
      return;
    }
    restart_output(this);
    return;
  }
  (*(this->super_io_object_t).super_i_poll_events._vptr_i_poll_events[0xc])(this,0);
  return;
}

Assistant:

void zmq::stream_engine_base_t::zap_msg_available ()
{
    zmq_assert (_mechanism != NULL);

    const int rc = _mechanism->zap_msg_available ();
    if (rc == -1) {
        error (protocol_error);
        return;
    }
    if (_input_stopped)
        if (!restart_input ())
            return;
    if (_output_stopped)
        restart_output ();
}